

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::AddIncludeFlags
          (cmNinjaTargetGenerator *this,string *languageFlags,string *language)

{
  cmGeneratorTarget *pcVar1;
  cmLocalNinjaGenerator *pcVar2;
  int iVar3;
  string *psVar4;
  cmGlobalNinjaGenerator *pcVar5;
  size_type sVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string includeFlags;
  
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  psVar4 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)pcVar2,&includes,pcVar1,language,psVar4);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  iVar3 = std::__cxx11::string::compare((char *)language);
  psVar4 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeFlags
            (&includeFlags,(cmLocalGenerator *)pcVar2,&includes,pcVar1,language,iVar3 == 0,false,
             psVar4);
  pcVar5 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  if ((pcVar5->UsingGCCOnWindows == true) && (includeFlags._M_string_length != 0)) {
    sVar6 = 0;
    do {
      if (includeFlags._M_dataplus._M_p[sVar6] == '\\') {
        includeFlags._M_dataplus._M_p[sVar6] = '/';
      }
      sVar6 = sVar6 + 1;
    } while (includeFlags._M_string_length != sVar6);
  }
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[6])(this->LocalGenerator,languageFlags,&includeFlags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includeFlags._M_dataplus._M_p != &includeFlags.field_2) {
    operator_delete(includeFlags._M_dataplus._M_p,includeFlags.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&includes);
  return;
}

Assistant:

void cmNinjaTargetGenerator::AddIncludeFlags(std::string& languageFlags,
                                             std::string const& language)
{
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              language, this->GetConfigName());
  // Add include directory flags.
  std::string includeFlags = this->LocalGenerator->GetIncludeFlags(
    includes, this->GeneratorTarget, language,
    language == "RC", // full include paths for RC needed by cmcldeps
    false, this->GetConfigName());
  if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
    std::replace(includeFlags.begin(), includeFlags.end(), '\\', '/');
  }

  this->LocalGenerator->AppendFlags(languageFlags, includeFlags);
}